

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

natwm_error config_array_to_box_sizes(config_array *array,box_sizes *result)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  config_value **ppcVar4;
  config_value *pcVar5;
  natwm_error nVar6;
  long lVar7;
  
  nVar6 = INVALID_INPUT_ERROR;
  if ((array != (config_array *)0x0) && (array->length == 4)) {
    ppcVar4 = array->values;
    lVar7 = 0;
    while (lVar7 != 4) {
      pcVar5 = ppcVar4[lVar7];
      if (pcVar5 == (config_value *)0x0) {
        return INVALID_INPUT_ERROR;
      }
      if (pcVar5->type != NUMBER) {
        return INVALID_INPUT_ERROR;
      }
      lVar7 = lVar7 + 1;
      if (0xffff < (pcVar5->data).number) {
        __assert_fail("value->data.number <= UINT16_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/common/util.c"
                      ,0x23,
                      "enum natwm_error config_array_to_box_sizes(const struct config_array *, struct box_sizes *)"
                     );
      }
    }
    uVar1 = *(uint16_t *)&ppcVar4[1]->data;
    uVar2 = *(uint16_t *)&ppcVar4[2]->data;
    uVar3 = *(uint16_t *)&ppcVar4[3]->data;
    result->top = *(uint16_t *)&(*ppcVar4)->data;
    result->right = uVar1;
    result->bottom = uVar2;
    result->left = uVar3;
    nVar6 = NO_ERROR;
  }
  return nVar6;
}

Assistant:

enum natwm_error config_array_to_box_sizes(const struct config_array *array,
                                           struct box_sizes *result)
{
        if (array == NULL || array->length != 4) {
                return INVALID_INPUT_ERROR;
        }

        struct box_sizes sizes = {
                .top = 0,
                .right = 0,
                .bottom = 0,
                .left = 0,
        };

        for (size_t i = 0; i < 4; ++i) {
                struct config_value *value = array->values[i];

                if (value == NULL || value->type != NUMBER) {
                        return INVALID_INPUT_ERROR;
                }

                assert(value->data.number <= UINT16_MAX);
        }

        sizes.top = (uint16_t)array->values[0]->data.number;
        sizes.right = (uint16_t)array->values[1]->data.number;
        sizes.bottom = (uint16_t)array->values[2]->data.number;
        sizes.left = (uint16_t)array->values[3]->data.number;

        *result = sizes;

        return NO_ERROR;
}